

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_create(char *zipname,char **filenames,size_t len)

{
  char cVar1;
  char *__file;
  byte bVar2;
  char *pcVar3;
  mz_bool mVar4;
  int iVar5;
  char *pcVar6;
  char *pArchive_name;
  uint ext_attributes;
  size_t sVar7;
  int iVar8;
  mz_zip_archive zip_archive;
  stat file_stat;
  mz_zip_archive local_128;
  stat local_c0;
  
  iVar5 = -1;
  if ((zipname != (char *)0x0) && (*zipname != '\0')) {
    local_128.m_pIO_opaque = (void *)0x0;
    local_128.m_pState = (mz_zip_internal_state *)0x0;
    local_128.m_pRead = (mz_file_read_func)0x0;
    local_128.m_pWrite = (mz_file_write_func)0x0;
    local_128.m_pRealloc = (mz_realloc_func)0x0;
    local_128.m_pAlloc_opaque = (void *)0x0;
    local_128.m_pAlloc = (mz_alloc_func)0x0;
    local_128.m_pFree = (mz_free_func)0x0;
    local_128.m_total_files = 0;
    local_128.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_128.m_file_offset_alignment = 0;
    local_128._28_4_ = 0;
    local_128.m_archive_size = 0;
    local_128.m_central_directory_file_ofs = 0;
    iVar8 = 0;
    mVar4 = mz_zip_writer_init_file(&local_128,zipname,0);
    if (mVar4 != 0) {
      memset(&local_c0,0,0x90);
      if (len != 0) {
        ext_attributes = 0;
        sVar7 = 0;
        do {
          __file = filenames[sVar7];
          if (__file == (char *)0x0) {
LAB_003a0329:
            iVar8 = -1;
            goto LAB_003a032f;
          }
          iVar5 = stat(__file,&local_c0);
          if (iVar5 != 0) {
            return -1;
          }
          bVar2 = 1;
          pcVar6 = __file;
          pcVar3 = __file;
          while( true ) {
            do {
              pArchive_name = pcVar6;
              pcVar6 = pcVar3 + 1;
              cVar1 = *pcVar3;
              pcVar3 = pcVar6;
            } while (cVar1 == '/');
            if (cVar1 == '\0') break;
            bVar2 = 0;
            pcVar6 = pArchive_name;
          }
          if (*pArchive_name == '\0') {
            pArchive_name = pArchive_name + -(ulong)(bVar2 & *__file == '/');
          }
          ext_attributes = ext_attributes | local_c0.st_mode << 0x10 | local_c0.st_mode >> 7 & 1 ^ 1
          ;
          mVar4 = mz_zip_writer_add_file(&local_128,pArchive_name,__file,"",0,6,ext_attributes);
          if (mVar4 == 0) goto LAB_003a0329;
          sVar7 = sVar7 + 1;
        } while (sVar7 != len);
        iVar8 = 0;
      }
LAB_003a032f:
      mz_zip_writer_finalize_archive(&local_128);
      mz_zip_writer_end(&local_128);
      iVar5 = iVar8;
    }
  }
  return iVar5;
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int status = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return -1;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return -1;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return -1;
  }

  memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT));

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      status = -1;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      return -1;
    }

    if ((file_stat.st_mode & 0200) == 0) {
      // MS-DOS read-only attribute
      ext_attributes |= 0x01;
    }
    ext_attributes |= (mz_uint32)((file_stat.st_mode & 0xFFFF) << 16);

    if (!mz_zip_writer_add_file(&zip_archive, base_name(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      status = -1;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return status;
}